

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

void cvRescale(CVodeMem cv_mem)

{
  uint nvec;
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = cv_mem->cv_eta;
  cv_mem->cv_cvals[0] = dVar2;
  nvec = cv_mem->cv_q;
  if (0 < (int)nvec) {
    uVar1 = 0;
    dVar3 = dVar2;
    do {
      dVar3 = dVar3 * dVar2;
      cv_mem->cv_cvals[uVar1 + 1] = dVar3;
      uVar1 = uVar1 + 1;
    } while (nvec != uVar1);
  }
  N_VScaleVectorArray(nvec,cv_mem->cv_cvals,cv_mem->cv_zn + 1,cv_mem->cv_zn + 1);
  dVar2 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar2;
  cv_mem->cv_next_h = dVar2;
  cv_mem->cv_hscale = dVar2;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j=1; j <= cv_mem->cv_q; j++)
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j-1];

  (void) N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                             cv_mem->cv_zn+1, cv_mem->cv_zn+1);

  cv_mem->cv_h = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon = 0;
}